

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internaltypes.cpp
# Opt level: O1

void __thiscall
libcellml::HistoryEpoch::setDestinationModel
          (HistoryEpoch *this,ImportedEntityConstPtr *importedEntity)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _func_int **pp_Var1;
  EntityImpl *pEVar2;
  bool bVar3;
  ImportSource local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  bVar3 = ImportedEntity::isImport
                    ((importedEntity->
                     super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr);
  if (bVar3) {
    ImportedEntity::importSource
              ((importedEntity->
               super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    ImportSource::model(&local_38);
    pEVar2 = local_38.super_Entity.mPimpl;
    pp_Var1 = local_38.super_Entity._vptr_Entity;
    local_38.super_Entity._vptr_Entity = (_func_int **)0x0;
    local_38.super_Entity.mPimpl = (EntityImpl *)0x0;
    this_00 = (this->mDestinationModel).
              super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->mDestinationModel).super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)pp_Var1;
    (this->mDestinationModel).super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pEVar2;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.super_Entity.mPimpl !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.super_Entity.mPimpl);
    }
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    }
  }
  return;
}

Assistant:

void HistoryEpoch::setDestinationModel(const ImportedEntityConstPtr &importedEntity)
{
    if (importedEntity->isImport()) {
        mDestinationModel = importedEntity->importSource()->model();
    }
}